

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Clara::CommandLine<Catch::ConfigData>::ArgBinder::~ArgBinder(ArgBinder *this)

{
  CommandLine<Catch::ConfigData> *pCVar1;
  bool bVar2;
  element_type *peVar3;
  logic_error *this_00;
  Arg *this_01;
  __enable_if_t<is_constructible<value_type,_pair<int,_Arg>_>::value,_pair<iterator,_bool>_> _Var4;
  auto_ptr<Clara::CommandLine<Catch::ConfigData>::Arg> local_c0;
  Arg *local_b8;
  _Base_ptr local_b0;
  undefined1 local_a8;
  pair<int,_Clara::CommandLine<Catch::ConfigData>::Arg> local_a0;
  ArgBinder *local_10;
  ArgBinder *this_local;
  
  local_10 = this;
  if (this->m_cl != (CommandLine<Catch::ConfigData> *)0x0) {
    Arg::validate(&this->m_arg);
    bVar2 = Arg::isFixedPositional(&this->m_arg);
    if (bVar2) {
      pCVar1 = this->m_cl;
      std::make_pair<int&,Clara::CommandLine<Catch::ConfigData>::Arg&>
                (&local_a0,&(this->m_arg).position,&this->m_arg);
      _Var4 = std::
              map<int,Clara::CommandLine<Catch::ConfigData>::Arg,std::less<int>,std::allocator<std::pair<int_const,Clara::CommandLine<Catch::ConfigData>::Arg>>>
              ::insert<std::pair<int,Clara::CommandLine<Catch::ConfigData>::Arg>>
                        ((map<int,Clara::CommandLine<Catch::ConfigData>::Arg,std::less<int>,std::allocator<std::pair<int_const,Clara::CommandLine<Catch::ConfigData>::Arg>>>
                          *)&pCVar1->m_positionalArgs,&local_a0);
      local_b0 = (_Base_ptr)_Var4.first._M_node;
      local_a8 = _Var4.second;
      std::pair<int,_Clara::CommandLine<Catch::ConfigData>::Arg>::~pair(&local_a0);
      if (this->m_cl->m_highestSpecifiedArgPosition < (this->m_arg).position) {
        this->m_cl->m_highestSpecifiedArgPosition = (this->m_arg).position;
      }
    }
    else {
      bVar2 = Arg::isAnyPositional(&this->m_arg);
      if (bVar2) {
        peVar3 = std::auto_ptr<Clara::CommandLine<Catch::ConfigData>::Arg>::get(&this->m_cl->m_arg);
        if (peVar3 != (element_type *)0x0) {
          this_00 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(this_00,"Only one unpositional argument can be added");
          __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        this_01 = (Arg *)operator_new(0x88);
        Arg::Arg(this_01,&this->m_arg);
        std::auto_ptr<Clara::CommandLine<Catch::ConfigData>::Arg>::auto_ptr(&local_c0,this_01);
        local_b8 = (Arg *)std::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&local_c0);
        std::auto_ptr<Clara::CommandLine<Catch::ConfigData>::Arg>::operator=
                  (&this->m_cl->m_arg,
                   (auto_ptr_ref<Clara::CommandLine<Catch::ConfigData>::Arg>)local_b8);
        std::auto_ptr<Clara::CommandLine<Catch::ConfigData>::Arg>::~auto_ptr(&local_c0);
      }
      else {
        std::
        vector<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>
        ::push_back(&this->m_cl->m_options,&this->m_arg);
      }
    }
  }
  Arg::~Arg(&this->m_arg);
  return;
}

Assistant:

~ArgBinder() {
                if( m_cl ) {
                    m_arg.validate();
                    if( m_arg.isFixedPositional() ) {
                        m_cl->m_positionalArgs.insert( std::make_pair( m_arg.position, m_arg ) );
                        if( m_arg.position > m_cl->m_highestSpecifiedArgPosition )
                            m_cl->m_highestSpecifiedArgPosition = m_arg.position;
                    }
                    else if( m_arg.isAnyPositional() ) {
                        if( m_cl->m_arg.get() )
                            throw std::logic_error( "Only one unpositional argument can be added" );
                        m_cl->m_arg = std::auto_ptr<Arg>( new Arg( m_arg ) );
                    }
                    else
                        m_cl->m_options.push_back( m_arg );
                }
            }